

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unswitch_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::anon_unknown_0::LoopUnswitch::IsDynamicallyUniform
          (LoopUnswitch *this,Instruction *var,BasicBlock *entry,DominatorTree *post_dom_tree)

{
  IRContext *pIVar1;
  DefUseManager *this_00;
  ulong uVar2;
  DecorationManager *this_01;
  pointer pOVar3;
  uint **ppuVar4;
  bool bVar5;
  char cVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  _Hash_node_base *p_Var9;
  _func_void *p_Var10;
  BasicBlock *pBVar11;
  Instruction *pIVar12;
  uint **ppuVar13;
  ulong uVar14;
  __node_base_ptr p_Var15;
  __node_base_ptr p_Var16;
  pointer pOVar17;
  byte bVar18;
  undefined8 *local_88;
  undefined8 uStack_80;
  code *local_78;
  code *pcStack_70;
  uint *local_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  if (post_dom_tree->postdominator_ == false) {
    __assert_fail("post_dom_tree.IsPostDominator()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp"
                  ,0x1ed,
                  "bool spvtools::opt::(anonymous namespace)::LoopUnswitch::IsDynamicallyUniform(Instruction *, const BasicBlock *, const DominatorTree &)"
                 );
  }
  pIVar1 = this->context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  this_00 = (pIVar1->def_use_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  uVar7 = 0;
  if (var->has_result_id_ == true) {
    uVar7 = Instruction::GetSingleWordOperand(var,(uint)var->has_type_id_);
  }
  uVar2 = (this->dynamically_uniform_)._M_h._M_bucket_count;
  uVar14 = (ulong)uVar7 % uVar2;
  p_Var15 = (this->dynamically_uniform_)._M_h._M_buckets[uVar14];
  p_Var16 = (__node_base_ptr)0x0;
  if ((p_Var15 != (__node_base_ptr)0x0) &&
     (p_Var9 = p_Var15->_M_nxt, p_Var16 = p_Var15, uVar7 != *(uint *)&p_Var15->_M_nxt[1]._M_nxt)) {
    while (p_Var15 = p_Var9, p_Var9 = p_Var15->_M_nxt, p_Var9 != (_Hash_node_base *)0x0) {
      p_Var16 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var9[1]._M_nxt % uVar2 != uVar14) ||
         (p_Var16 = p_Var15, uVar7 == *(uint *)&p_Var9[1]._M_nxt)) goto LAB_0025c6da;
    }
    p_Var16 = (__node_base_ptr)0x0;
  }
LAB_0025c6da:
  if (p_Var16 == (__node_base_ptr)0x0) {
    p_Var9 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var9 = p_Var16->_M_nxt;
  }
  if (p_Var9 != (_Hash_node_base *)0x0) {
    bVar18 = *(byte *)((long)&p_Var9[1]._M_nxt + 4);
    goto LAB_0025c8b9;
  }
  pIVar1 = this->context_;
  if ((pIVar1->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
    IRContext::BuildDecorationManager(pIVar1);
  }
  this_01 = (pIVar1->decoration_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>._M_head_impl
  ;
  uVar8 = 0;
  uVar7 = 0;
  if (var->has_result_id_ == true) {
    uVar7 = Instruction::GetSingleWordOperand(var,(uint)var->has_type_id_);
  }
  local_88 = (undefined8 *)CONCAT44(local_88._4_4_,uVar7);
  p_Var10 = (_func_void *)
            std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->dynamically_uniform_,(key_type *)&local_88);
  *p_Var10 = (_func_void)0x0;
  if (var->has_result_id_ == true) {
    uVar8 = Instruction::GetSingleWordOperand(var,(uint)var->has_type_id_);
  }
  local_58._8_8_ = 0;
  pcStack_40 = std::
               _Function_handler<bool_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp:507:34)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp:507:34)>
             ::_M_manager;
  local_58._M_unused._M_function_pointer = p_Var10;
  analysis::DecorationManager::WhileEachDecoration
            (this_01,uVar8,0x1a,(function<bool_(const_spvtools::opt::Instruction_&)> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  bVar18 = 1;
  if (*p_Var10 != (_func_void)0x0) goto LAB_0025c8b9;
  pBVar11 = IRContext::get_instr_block(this->context_,var);
  if (pBVar11 == (BasicBlock *)0x0) {
    *p_Var10 = (_func_void)0x1;
    goto LAB_0025c8b9;
  }
  pIVar12 = (pBVar11->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar8 = 0;
  uVar7 = 0;
  if (pIVar12->has_result_id_ == true) {
    uVar7 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
  }
  pIVar12 = (entry->label_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar12->has_result_id_ == true) {
    uVar8 = Instruction::GetSingleWordOperand(pIVar12,(uint)pIVar12->has_type_id_);
  }
  bVar5 = DominatorTree::Dominates(post_dom_tree,uVar7,uVar8);
  if (bVar5) {
    if (var->opcode_ == OpLoad) {
      uVar7 = (var->has_result_id_ & 1) + 1;
      if (var->has_type_id_ == false) {
        uVar7 = (uint)var->has_result_id_;
      }
      uVar7 = Instruction::GetSingleWordOperand(var,uVar7);
      pIVar12 = analysis::DefUseManager::GetDef(this_00,uVar7);
      uVar7 = 0;
      if (pIVar12->has_type_id_ == true) {
        uVar7 = Instruction::GetSingleWordOperand(pIVar12,0);
      }
      pIVar12 = analysis::DefUseManager::GetDef(this_00,uVar7);
      uVar7 = (pIVar12->has_result_id_ & 1) + 1;
      if (pIVar12->has_type_id_ == false) {
        uVar7 = (uint)pIVar12->has_result_id_;
      }
      uVar7 = Instruction::GetSingleWordOperand(pIVar12,uVar7);
      if ((uVar7 & 0xfffffffd) == 0) {
LAB_0025c8e4:
        local_78 = (code *)0x0;
        pcStack_70 = (code *)0x0;
        local_88 = (undefined8 *)0x0;
        uStack_80 = 0;
        local_88 = (undefined8 *)operator_new(0x18);
        *local_88 = entry;
        local_88[1] = post_dom_tree;
        local_88[2] = this;
        pcStack_70 = std::
                     _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp:539:44)>
                     ::_M_invoke;
        local_78 = std::
                   _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp:539:44)>
                   ::_M_manager;
        pOVar17 = (var->operands_).
                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pOVar3 = (var->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        bVar18 = pOVar17 == pOVar3;
        if (!(bool)bVar18) {
          bVar18 = false;
          do {
            bVar5 = spvIsInIdType(pOVar17->type);
            if (bVar5) {
              ppuVar4 = (uint **)(pOVar17->words).large_data_._M_t.
                                 super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                                 ._M_head_impl;
              ppuVar13 = &(pOVar17->words).small_data_;
              if (ppuVar4 != (uint **)0x0) {
                ppuVar13 = ppuVar4;
              }
              local_60 = *ppuVar13;
              if (local_78 == (code *)0x0) {
                std::__throw_bad_function_call();
              }
              cVar6 = (*pcStack_70)(&local_88,&local_60);
              if (cVar6 == '\0') break;
            }
            pOVar17 = pOVar17 + 1;
            bVar18 = pOVar17 == pOVar3;
          } while (!(bool)bVar18);
        }
        *p_Var10 = (_func_void)bVar18;
        if (local_78 != (code *)0x0) {
          (*local_78)(&local_88,&local_88,3);
        }
        goto LAB_0025c8b9;
      }
    }
    else {
      bVar5 = IRContext::IsCombinatorInstruction(this->context_,var);
      if (bVar5) goto LAB_0025c8e4;
    }
  }
  *p_Var10 = (_func_void)0x0;
  bVar18 = 0;
LAB_0025c8b9:
  return (bool)(bVar18 & 1);
}

Assistant:

bool IsDynamicallyUniform(Instruction* var, const BasicBlock* entry,
                            const DominatorTree& post_dom_tree) {
    assert(post_dom_tree.IsPostDominator());
    analysis::DefUseManager* def_use_mgr = context_->get_def_use_mgr();

    auto it = dynamically_uniform_.find(var->result_id());

    if (it != dynamically_uniform_.end()) return it->second;

    analysis::DecorationManager* dec_mgr = context_->get_decoration_mgr();

    bool& is_uniform = dynamically_uniform_[var->result_id()];
    is_uniform = false;

    dec_mgr->WhileEachDecoration(var->result_id(),
                                 uint32_t(spv::Decoration::Uniform),
                                 [&is_uniform](const Instruction&) {
                                   is_uniform = true;
                                   return false;
                                 });
    if (is_uniform) {
      return is_uniform;
    }

    BasicBlock* parent = context_->get_instr_block(var);
    if (!parent) {
      return is_uniform = true;
    }

    if (!post_dom_tree.Dominates(parent->id(), entry->id())) {
      return is_uniform = false;
    }
    if (var->opcode() == spv::Op::OpLoad) {
      const uint32_t PtrTypeId =
          def_use_mgr->GetDef(var->GetSingleWordInOperand(0))->type_id();
      const Instruction* PtrTypeInst = def_use_mgr->GetDef(PtrTypeId);
      auto storage_class = spv::StorageClass(
          PtrTypeInst->GetSingleWordInOperand(kTypePointerStorageClassInIdx));
      if (storage_class != spv::StorageClass::Uniform &&
          storage_class != spv::StorageClass::UniformConstant) {
        return is_uniform = false;
      }
    } else {
      if (!context_->IsCombinatorInstruction(var)) {
        return is_uniform = false;
      }
    }

    return is_uniform = var->WhileEachInId([entry, &post_dom_tree,
                                            this](const uint32_t* id) {
      return IsDynamicallyUniform(context_->get_def_use_mgr()->GetDef(*id),
                                  entry, post_dom_tree);
    });
  }